

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

LBBox3fa * __thiscall
embree::avx2::LineSegmentsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,LineSegmentsISA *this,LinearSpace3fa *space,
          size_t primID,BBox1f *time_range)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ulong uVar14;
  size_t *psVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar59;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar58;
  float fVar63;
  float fVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar65;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar62;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  
  fVar1 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
  fVar23 = (this->super_LineSegments).super_Geometry.time_range.lower;
  fVar87 = (this->super_LineSegments).super_Geometry.time_range.upper - fVar23;
  fVar30 = (time_range->lower - fVar23) / fVar87;
  fVar87 = (time_range->upper - fVar23) / fVar87;
  fVar23 = fVar1 * fVar30;
  fVar31 = fVar87 * fVar1;
  auVar51 = vroundss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),9);
  auVar40 = vroundss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31),10);
  auVar46 = ZEXT816(0) << 0x40;
  auVar44 = vmaxss_avx(auVar51,auVar46);
  auVar39 = vminss_avx(auVar40,ZEXT416((uint)fVar1));
  fVar49 = auVar44._0_4_;
  fVar47 = auVar39._0_4_;
  iVar16 = -1;
  if (-1 < (int)auVar51._0_4_) {
    iVar16 = (int)auVar51._0_4_;
  }
  uVar9 = (int)fVar1 + 1U;
  if ((int)auVar40._0_4_ < (int)((int)fVar1 + 1U)) {
    uVar9 = (int)auVar40._0_4_;
  }
  lVar18 = (long)(int)fVar49;
  uVar17 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                    primID * *(long *)&(this->super_LineSegments).field_0x68);
  uVar14 = (ulong)uVar17;
  pBVar6 = (this->super_LineSegments).vertices.items;
  pcVar7 = pBVar6[lVar18].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[lVar18].super_RawBufferView.stride;
  lVar20 = sVar8 * uVar14;
  uVar19 = (ulong)(uVar17 + 1);
  lVar22 = sVar8 * uVar19;
  uVar2 = *(undefined4 *)(pcVar7 + lVar20);
  auVar39._4_4_ = uVar2;
  auVar39._0_4_ = uVar2;
  auVar39._8_4_ = uVar2;
  auVar39._12_4_ = uVar2;
  uVar2 = *(undefined4 *)(pcVar7 + lVar20 + 4);
  auVar44._4_4_ = uVar2;
  auVar44._0_4_ = uVar2;
  auVar44._8_4_ = uVar2;
  auVar44._12_4_ = uVar2;
  fVar3 = *(float *)(pcVar7 + lVar20 + 8);
  aVar4 = (space->vx).field_0;
  aVar5 = (space->vy).field_0;
  fVar10 = (space->vz).field_0.m128[0];
  fVar11 = (space->vz).field_0.m128[1];
  fVar12 = (space->vz).field_0.m128[2];
  fVar13 = (space->vz).field_0.m128[3];
  auVar51._0_4_ = fVar3 * fVar10;
  auVar51._4_4_ = fVar3 * fVar11;
  auVar51._8_4_ = fVar3 * fVar12;
  auVar51._12_4_ = fVar3 * fVar13;
  auVar44 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar5,auVar44);
  auVar44 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar39);
  uVar2 = *(undefined4 *)(pcVar7 + lVar20 + 0xc);
  auVar40._4_4_ = uVar2;
  auVar40._0_4_ = uVar2;
  auVar40._8_4_ = uVar2;
  auVar40._12_4_ = uVar2;
  auVar44 = vblendps_avx(auVar44,auVar40,8);
  uVar2 = *(undefined4 *)(pcVar7 + lVar22);
  auVar52._4_4_ = uVar2;
  auVar52._0_4_ = uVar2;
  auVar52._8_4_ = uVar2;
  auVar52._12_4_ = uVar2;
  uVar2 = *(undefined4 *)(pcVar7 + lVar22 + 4);
  auVar60._4_4_ = uVar2;
  auVar60._0_4_ = uVar2;
  auVar60._8_4_ = uVar2;
  auVar60._12_4_ = uVar2;
  fVar3 = *(float *)(pcVar7 + lVar22 + 8);
  auVar66._0_4_ = fVar3 * fVar10;
  auVar66._4_4_ = fVar3 * fVar11;
  auVar66._8_4_ = fVar3 * fVar12;
  auVar66._12_4_ = fVar3 * fVar13;
  auVar39 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar5,auVar60);
  auVar39 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar4,auVar52);
  uVar2 = *(undefined4 *)(pcVar7 + lVar22 + 0xc);
  auVar53._4_4_ = uVar2;
  auVar53._0_4_ = uVar2;
  auVar53._8_4_ = uVar2;
  auVar53._12_4_ = uVar2;
  auVar39 = vblendps_avx(auVar39,auVar53,8);
  auVar51 = vminps_avx(auVar44,auVar39);
  auVar44 = vmaxps_avx(auVar44,auVar39);
  fVar3 = (this->super_LineSegments).maxRadiusScale;
  auVar39 = vmaxss_avx(auVar53,auVar40);
  fVar59 = fVar3 * auVar39._0_4_;
  auVar41._4_4_ = fVar59;
  auVar41._0_4_ = fVar59;
  auVar41._8_4_ = fVar59;
  auVar41._12_4_ = fVar59;
  auVar40 = vsubps_avx(auVar51,auVar41);
  auVar42._0_4_ = auVar44._0_4_ + fVar59;
  auVar42._4_4_ = auVar44._4_4_ + fVar59;
  auVar42._8_4_ = auVar44._8_4_ + fVar59;
  auVar42._12_4_ = auVar44._12_4_ + fVar59;
  lVar20 = (long)(int)fVar47;
  pcVar7 = pBVar6[lVar20].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[lVar20].super_RawBufferView.stride;
  lVar21 = sVar8 * uVar14;
  lVar22 = sVar8 * uVar19;
  uVar2 = *(undefined4 *)(pcVar7 + lVar21 + 4);
  auVar54._4_4_ = uVar2;
  auVar54._0_4_ = uVar2;
  auVar54._8_4_ = uVar2;
  auVar54._12_4_ = uVar2;
  fVar59 = *(float *)(pcVar7 + lVar21 + 8);
  auVar61._0_4_ = fVar59 * fVar10;
  auVar61._4_4_ = fVar59 * fVar11;
  auVar61._8_4_ = fVar59 * fVar12;
  auVar61._12_4_ = fVar59 * fVar13;
  auVar44 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar5,auVar54);
  uVar2 = *(undefined4 *)(pcVar7 + lVar21);
  auVar55._4_4_ = uVar2;
  auVar55._0_4_ = uVar2;
  auVar55._8_4_ = uVar2;
  auVar55._12_4_ = uVar2;
  auVar44 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar55);
  fVar59 = *(float *)(pcVar7 + lVar22 + 8);
  auVar56._0_4_ = fVar10 * fVar59;
  auVar56._4_4_ = fVar11 * fVar59;
  auVar56._8_4_ = fVar12 * fVar59;
  auVar56._12_4_ = fVar13 * fVar59;
  uVar2 = *(undefined4 *)(pcVar7 + lVar22 + 4);
  auVar68._4_4_ = uVar2;
  auVar68._0_4_ = uVar2;
  auVar68._8_4_ = uVar2;
  auVar68._12_4_ = uVar2;
  auVar39 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar5,auVar68);
  uVar2 = *(undefined4 *)(pcVar7 + lVar22);
  auVar69._4_4_ = uVar2;
  auVar69._0_4_ = uVar2;
  auVar69._8_4_ = uVar2;
  auVar69._12_4_ = uVar2;
  auVar39 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar4,auVar69);
  uVar2 = *(undefined4 *)(pcVar7 + lVar21 + 0xc);
  auVar70._4_4_ = uVar2;
  auVar70._0_4_ = uVar2;
  auVar70._8_4_ = uVar2;
  auVar70._12_4_ = uVar2;
  auVar44 = vblendps_avx(auVar44,auVar70,8);
  uVar2 = *(undefined4 *)(pcVar7 + lVar22 + 0xc);
  auVar76._4_4_ = uVar2;
  auVar76._0_4_ = uVar2;
  auVar76._8_4_ = uVar2;
  auVar76._12_4_ = uVar2;
  auVar39 = vblendps_avx(auVar39,auVar76,8);
  auVar51 = vminps_avx(auVar44,auVar39);
  auVar44 = vmaxps_avx(auVar44,auVar39);
  auVar39 = vmaxss_avx(auVar76,auVar70);
  fVar59 = fVar3 * auVar39._0_4_;
  auVar71._4_4_ = fVar59;
  auVar71._0_4_ = fVar59;
  auVar71._8_4_ = fVar59;
  auVar71._12_4_ = fVar59;
  auVar39 = vsubps_avx(auVar51,auVar71);
  auVar57._0_4_ = fVar59 + auVar44._0_4_;
  auVar57._4_4_ = fVar59 + auVar44._4_4_;
  auVar57._8_4_ = fVar59 + auVar44._8_4_;
  auVar57._12_4_ = fVar59 + auVar44._12_4_;
  if (uVar9 - iVar16 == 1) {
    auVar44 = vmaxss_avx(ZEXT416((uint)(fVar23 - fVar49)),auVar46);
    fVar23 = auVar44._0_4_;
    fVar1 = 1.0 - fVar23;
    auVar50._0_4_ = auVar39._0_4_ * fVar23;
    auVar50._4_4_ = auVar39._4_4_ * fVar23;
    auVar50._8_4_ = auVar39._8_4_ * fVar23;
    auVar50._12_4_ = auVar39._12_4_ * fVar23;
    auVar48._4_4_ = fVar1;
    auVar48._0_4_ = fVar1;
    auVar48._8_4_ = fVar1;
    auVar48._12_4_ = fVar1;
    aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar50,auVar48,auVar40);
    auVar24._0_4_ = fVar23 * auVar57._0_4_;
    auVar24._4_4_ = fVar23 * auVar57._4_4_;
    auVar24._8_4_ = fVar23 * auVar57._8_4_;
    auVar24._12_4_ = fVar23 * auVar57._12_4_;
    aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar24,auVar42,auVar48);
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar4;
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar5;
    auVar44 = vmaxss_avx(ZEXT416((uint)(fVar47 - fVar31)),auVar46);
    fVar23 = auVar44._0_4_;
    fVar1 = 1.0 - fVar23;
    auVar45._0_4_ = fVar23 * auVar40._0_4_;
    auVar45._4_4_ = fVar23 * auVar40._4_4_;
    auVar45._8_4_ = fVar23 * auVar40._8_4_;
    auVar45._12_4_ = fVar23 * auVar40._12_4_;
    auVar32._4_4_ = fVar1;
    auVar32._0_4_ = fVar1;
    auVar32._8_4_ = fVar1;
    auVar32._12_4_ = fVar1;
    aVar62 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar39,auVar32,auVar45);
    auVar25._0_4_ = fVar23 * auVar42._0_4_;
    auVar25._4_4_ = fVar23 * auVar42._4_4_;
    auVar25._8_4_ = fVar23 * auVar42._8_4_;
    auVar25._12_4_ = fVar23 * auVar42._12_4_;
    aVar58 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar57,auVar32,auVar25);
  }
  else {
    pcVar7 = pBVar6[lVar18 + 1].super_RawBufferView.ptr_ofs;
    sVar8 = pBVar6[lVar18 + 1].super_RawBufferView.stride;
    lVar22 = sVar8 * uVar14;
    lVar18 = sVar8 * uVar19;
    uVar2 = *(undefined4 *)(pcVar7 + lVar22);
    auVar72._4_4_ = uVar2;
    auVar72._0_4_ = uVar2;
    auVar72._8_4_ = uVar2;
    auVar72._12_4_ = uVar2;
    uVar2 = *(undefined4 *)(pcVar7 + lVar22 + 4);
    auVar77._4_4_ = uVar2;
    auVar77._0_4_ = uVar2;
    auVar77._8_4_ = uVar2;
    auVar77._12_4_ = uVar2;
    fVar59 = *(float *)(pcVar7 + lVar22 + 8);
    auVar80._0_4_ = fVar59 * fVar10;
    auVar80._4_4_ = fVar59 * fVar11;
    auVar80._8_4_ = fVar59 * fVar12;
    auVar80._12_4_ = fVar59 * fVar13;
    auVar44 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar5,auVar77);
    auVar44 = vfmadd231ps_fma(auVar44,(undefined1  [16])aVar4,auVar72);
    uVar2 = *(undefined4 *)(pcVar7 + lVar22 + 0xc);
    auVar73._4_4_ = uVar2;
    auVar73._0_4_ = uVar2;
    auVar73._8_4_ = uVar2;
    auVar73._12_4_ = uVar2;
    auVar44 = vblendps_avx(auVar44,auVar73,8);
    uVar2 = *(undefined4 *)(pcVar7 + lVar18);
    auVar81._4_4_ = uVar2;
    auVar81._0_4_ = uVar2;
    auVar81._8_4_ = uVar2;
    auVar81._12_4_ = uVar2;
    uVar2 = *(undefined4 *)(pcVar7 + lVar18 + 4);
    auVar88._4_4_ = uVar2;
    auVar88._0_4_ = uVar2;
    auVar88._8_4_ = uVar2;
    auVar88._12_4_ = uVar2;
    fVar59 = *(float *)(pcVar7 + lVar18 + 8);
    auVar93._0_4_ = fVar59 * fVar10;
    auVar93._4_4_ = fVar59 * fVar11;
    auVar93._8_4_ = fVar59 * fVar12;
    auVar93._12_4_ = fVar59 * fVar13;
    auVar51 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar5,auVar88);
    auVar51 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar81);
    uVar2 = *(undefined4 *)(pcVar7 + lVar18 + 0xc);
    auVar82._4_4_ = uVar2;
    auVar82._0_4_ = uVar2;
    auVar82._8_4_ = uVar2;
    auVar82._12_4_ = uVar2;
    auVar51 = vblendps_avx(auVar51,auVar82,8);
    auVar46 = vminps_avx(auVar44,auVar51);
    auVar44 = vmaxps_avx(auVar44,auVar51);
    auVar51 = vmaxss_avx(auVar82,auVar73);
    fVar63 = fVar3 * auVar51._0_4_;
    auVar83._4_4_ = fVar63;
    auVar83._0_4_ = fVar63;
    auVar83._8_4_ = fVar63;
    auVar83._12_4_ = fVar63;
    auVar46 = vsubps_avx(auVar46,auVar83);
    pcVar7 = pBVar6[lVar20 + -1].super_RawBufferView.ptr_ofs;
    sVar8 = pBVar6[lVar20 + -1].super_RawBufferView.stride;
    lVar22 = sVar8 * uVar14;
    lVar20 = sVar8 * uVar19;
    uVar2 = *(undefined4 *)(pcVar7 + lVar22);
    auVar89._4_4_ = uVar2;
    auVar89._0_4_ = uVar2;
    auVar89._8_4_ = uVar2;
    auVar89._12_4_ = uVar2;
    uVar2 = *(undefined4 *)(pcVar7 + lVar22 + 4);
    auVar94._4_4_ = uVar2;
    auVar94._0_4_ = uVar2;
    auVar94._8_4_ = uVar2;
    auVar94._12_4_ = uVar2;
    fVar59 = *(float *)(pcVar7 + lVar22 + 8);
    auVar78._0_4_ = fVar59 * fVar10;
    auVar78._4_4_ = fVar59 * fVar11;
    auVar78._8_4_ = fVar59 * fVar12;
    auVar78._12_4_ = fVar59 * fVar13;
    auVar51 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar5,auVar94);
    auVar41 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar89);
    uVar2 = *(undefined4 *)(pcVar7 + lVar20 + 4);
    auVar90._4_4_ = uVar2;
    auVar90._0_4_ = uVar2;
    auVar90._8_4_ = uVar2;
    auVar90._12_4_ = uVar2;
    fVar59 = *(float *)(pcVar7 + lVar20 + 8);
    auVar96._0_4_ = fVar59 * fVar10;
    auVar96._4_4_ = fVar59 * fVar11;
    auVar96._8_4_ = fVar59 * fVar12;
    auVar96._12_4_ = fVar59 * fVar13;
    auVar51 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar5,auVar90);
    uVar2 = *(undefined4 *)(pcVar7 + lVar20);
    auVar91._4_4_ = uVar2;
    auVar91._0_4_ = uVar2;
    auVar91._8_4_ = uVar2;
    auVar91._12_4_ = uVar2;
    auVar52 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar91);
    auVar51 = vmaxss_avx(ZEXT416((uint)(fVar23 - fVar49)),ZEXT416(0));
    fVar49 = auVar51._0_4_;
    fVar23 = 1.0 - fVar49;
    auVar74._0_4_ = fVar49 * auVar46._0_4_;
    auVar74._4_4_ = fVar49 * auVar46._4_4_;
    auVar74._8_4_ = fVar49 * auVar46._8_4_;
    auVar74._12_4_ = fVar49 * auVar46._12_4_;
    auVar33._4_4_ = fVar23;
    auVar33._0_4_ = fVar23;
    auVar33._8_4_ = fVar23;
    auVar33._12_4_ = fVar23;
    auVar46 = vfmadd213ps_fma(auVar40,auVar33,auVar74);
    auVar75._0_4_ = fVar49 * (auVar44._0_4_ + fVar63);
    auVar75._4_4_ = fVar49 * (auVar44._4_4_ + fVar63);
    auVar75._8_4_ = fVar49 * (auVar44._8_4_ + fVar63);
    auVar75._12_4_ = fVar49 * (auVar44._12_4_ + fVar63);
    uVar2 = *(undefined4 *)(pcVar7 + lVar22 + 0xc);
    auVar84._4_4_ = uVar2;
    auVar84._0_4_ = uVar2;
    auVar84._8_4_ = uVar2;
    auVar84._12_4_ = uVar2;
    auVar44 = vblendps_avx(auVar41,auVar84,8);
    auVar43 = vfmadd213ps_fma(auVar42,auVar33,auVar75);
    uVar2 = *(undefined4 *)(pcVar7 + lVar20 + 0xc);
    auVar34._4_4_ = uVar2;
    auVar34._0_4_ = uVar2;
    auVar34._8_4_ = uVar2;
    auVar34._12_4_ = uVar2;
    auVar51 = vblendps_avx(auVar52,auVar34,8);
    auVar40 = vminps_avx(auVar44,auVar51);
    auVar44 = vmaxps_avx(auVar44,auVar51);
    auVar51 = vmaxss_avx(auVar34,auVar84);
    fVar23 = fVar3 * auVar51._0_4_;
    auVar35._4_4_ = fVar23;
    auVar35._0_4_ = fVar23;
    auVar35._8_4_ = fVar23;
    auVar35._12_4_ = fVar23;
    auVar40 = vsubps_avx(auVar40,auVar35);
    auVar51 = vmaxss_avx(ZEXT416((uint)(fVar47 - fVar31)),ZEXT416(0));
    fVar47 = auVar51._0_4_;
    fVar31 = 1.0 - fVar47;
    auVar79._0_4_ = fVar47 * auVar40._0_4_;
    auVar79._4_4_ = fVar47 * auVar40._4_4_;
    auVar79._8_4_ = fVar47 * auVar40._8_4_;
    auVar79._12_4_ = fVar47 * auVar40._12_4_;
    auVar85._4_4_ = fVar31;
    auVar85._0_4_ = fVar31;
    auVar85._8_4_ = fVar31;
    auVar85._12_4_ = fVar31;
    aVar62 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar39,auVar85,auVar79);
    auVar36._0_4_ = fVar47 * (auVar44._0_4_ + fVar23);
    auVar36._4_4_ = fVar47 * (auVar44._4_4_ + fVar23);
    auVar36._8_4_ = fVar47 * (auVar44._8_4_ + fVar23);
    auVar36._12_4_ = fVar47 * (auVar44._12_4_ + fVar23);
    aVar58 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar57,auVar85,auVar36);
    uVar17 = iVar16 + 1;
    if ((int)uVar17 < (int)uVar9) {
      psVar15 = &pBVar6[uVar17].super_RawBufferView.stride;
      auVar44 = auVar43;
      auVar39 = auVar46;
      do {
        fVar31 = ((float)(int)uVar17 / fVar1 - fVar30) / (fVar87 - fVar30);
        fVar23 = 1.0 - fVar31;
        auVar86._0_4_ = aVar62.m128[0] * fVar31;
        fVar63 = aVar62.m128[1];
        auVar86._4_4_ = fVar63 * fVar31;
        fVar64 = aVar62.m128[2];
        auVar86._8_4_ = fVar64 * fVar31;
        fVar65 = aVar62.m128[3];
        auVar86._12_4_ = fVar65 * fVar31;
        auVar97._4_4_ = fVar23;
        auVar97._0_4_ = fVar23;
        auVar97._8_4_ = fVar23;
        auVar97._12_4_ = fVar23;
        auVar41 = vfmadd231ps_fma(auVar86,auVar97,auVar39);
        auVar92._0_4_ = aVar58.m128[0] * fVar31;
        fVar47 = aVar58.m128[1];
        auVar92._4_4_ = fVar47 * fVar31;
        fVar49 = aVar58.m128[2];
        auVar92._8_4_ = fVar49 * fVar31;
        fVar59 = aVar58.m128[3];
        auVar92._12_4_ = fVar59 * fVar31;
        auVar42 = vfmadd231ps_fma(auVar92,auVar44,auVar97);
        pcVar7 = ((RawBufferView *)(psVar15 + -2))->ptr_ofs;
        lVar22 = *psVar15 * uVar14;
        lVar20 = *psVar15 * uVar19;
        uVar2 = *(undefined4 *)(pcVar7 + lVar22);
        auVar37._4_4_ = uVar2;
        auVar37._0_4_ = uVar2;
        auVar37._8_4_ = uVar2;
        auVar37._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(pcVar7 + lVar22 + 4);
        auVar98._4_4_ = uVar2;
        auVar98._0_4_ = uVar2;
        auVar98._8_4_ = uVar2;
        auVar98._12_4_ = uVar2;
        fVar23 = *(float *)(pcVar7 + lVar22 + 8);
        auVar95._0_4_ = fVar23 * fVar10;
        auVar95._4_4_ = fVar23 * fVar11;
        auVar95._8_4_ = fVar23 * fVar12;
        auVar95._12_4_ = fVar23 * fVar13;
        auVar51 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar5,auVar98);
        auVar51 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar4,auVar37);
        uVar2 = *(undefined4 *)(pcVar7 + lVar22 + 0xc);
        auVar38._4_4_ = uVar2;
        auVar38._0_4_ = uVar2;
        auVar38._8_4_ = uVar2;
        auVar38._12_4_ = uVar2;
        auVar51 = vblendps_avx(auVar51,auVar38,8);
        uVar2 = *(undefined4 *)(pcVar7 + lVar20);
        auVar99._4_4_ = uVar2;
        auVar99._0_4_ = uVar2;
        auVar99._8_4_ = uVar2;
        auVar99._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(pcVar7 + lVar20 + 4);
        auVar26._4_4_ = uVar2;
        auVar26._0_4_ = uVar2;
        auVar26._8_4_ = uVar2;
        auVar26._12_4_ = uVar2;
        fVar23 = *(float *)(pcVar7 + lVar20 + 8);
        auVar67._0_4_ = fVar23 * fVar10;
        auVar67._4_4_ = fVar23 * fVar11;
        auVar67._8_4_ = fVar23 * fVar12;
        auVar67._12_4_ = fVar23 * fVar13;
        auVar40 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar5,auVar26);
        auVar40 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar4,auVar99);
        uVar2 = *(undefined4 *)(pcVar7 + lVar20 + 0xc);
        auVar27._4_4_ = uVar2;
        auVar27._0_4_ = uVar2;
        auVar27._8_4_ = uVar2;
        auVar27._12_4_ = uVar2;
        auVar40 = vblendps_avx(auVar40,auVar27,8);
        auVar46 = vminps_avx(auVar51,auVar40);
        auVar51 = vmaxps_avx(auVar51,auVar40);
        auVar40 = vmaxss_avx(auVar27,auVar38);
        fVar23 = auVar40._0_4_ * fVar3;
        auVar28._4_4_ = fVar23;
        auVar28._0_4_ = fVar23;
        auVar28._8_4_ = fVar23;
        auVar28._12_4_ = fVar23;
        auVar40 = vsubps_avx(auVar46,auVar28);
        auVar40 = vsubps_avx(auVar40,auVar41);
        auVar29._0_4_ = auVar51._0_4_ + fVar23;
        auVar29._4_4_ = auVar51._4_4_ + fVar23;
        auVar29._8_4_ = auVar51._8_4_ + fVar23;
        auVar29._12_4_ = auVar51._12_4_ + fVar23;
        auVar41 = vsubps_avx(auVar29,auVar42);
        auVar51 = vminps_avx(auVar40,ZEXT816(0));
        auVar46._0_4_ = auVar39._0_4_ + auVar51._0_4_;
        auVar46._4_4_ = auVar39._4_4_ + auVar51._4_4_;
        auVar46._8_4_ = auVar39._8_4_ + auVar51._8_4_;
        auVar46._12_4_ = auVar39._12_4_ + auVar51._12_4_;
        aVar62._0_4_ = aVar62.m128[0] + auVar51._0_4_;
        aVar62._4_4_ = fVar63 + auVar51._4_4_;
        aVar62._8_4_ = fVar64 + auVar51._8_4_;
        aVar62._12_4_ = fVar65 + auVar51._12_4_;
        auVar39 = vmaxps_avx(auVar41,ZEXT816(0));
        auVar43._0_4_ = auVar44._0_4_ + auVar39._0_4_;
        auVar43._4_4_ = auVar44._4_4_ + auVar39._4_4_;
        auVar43._8_4_ = auVar44._8_4_ + auVar39._8_4_;
        auVar43._12_4_ = auVar44._12_4_ + auVar39._12_4_;
        aVar58._0_4_ = aVar58.m128[0] + auVar39._0_4_;
        aVar58._4_4_ = fVar47 + auVar39._4_4_;
        aVar58._8_4_ = fVar49 + auVar39._8_4_;
        aVar58._12_4_ = fVar59 + auVar39._12_4_;
        uVar17 = uVar17 + 1;
        psVar15 = psVar15 + 7;
        auVar44 = auVar43;
        auVar39 = auVar46;
      } while (uVar9 != uVar17);
    }
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar46;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar43;
  }
  (__return_storage_ptr__->bounds1).lower.field_0 = aVar62;
  (__return_storage_ptr__->bounds1).upper.field_0 = aVar58;
  return __return_storage_ptr__;
}

Assistant:

__forceinline LBBox3fa linearBounds(const LinearSpace3fa& space, size_t primID, const BBox1f& dt) const {
      return LBBox3fa([&] (size_t itime) { return bounds(space, primID, itime); }, dt, time_range, fnumTimeSegments);
    }